

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O2

string * __thiscall
adapt::cuf::Format<double,double,std::__cxx11::string>
          (string *__return_storage_ptr__,cuf *this,string *format,double *values,double *values_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values_2)

{
  const_iterator itend;
  const_iterator it;
  const_iterator local_20;
  const_iterator local_18;
  
  local_18._M_current = *(char **)this;
  local_20._M_current = local_18._M_current + *(long *)(this + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::Format_impl<double,double,std::__cxx11::string>
            (__return_storage_ptr__,&local_18,&local_20,(double *)format,values,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)values_1);
  return __return_storage_ptr__;
}

Assistant:

std::string Format(const std::string& format, const Values& ...values)
{
	std::string::const_iterator it = format.begin();
	std::string::const_iterator itend = format.end();
	std::string result;
	detail::Format_impl(result, it, itend, values...);
	return result;
}